

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O0

bool matchWhileUnsplitting
               (char *buffer,int buffer_len,int start,char *needle,int needle_len,int *matchlen,
               int *lines)

{
  long in_RCX;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  int in_R8D;
  int *in_R9;
  int n;
  int x;
  int local_38;
  int local_34;
  
  local_38 = 0;
  local_34 = in_EDX;
  while( true ) {
    if (in_R8D <= local_38) {
      *in_R9 = local_34 - in_EDX;
      return true;
    }
    if ((in_ESI <= local_34) || (in_RDI[local_34] != *(char *)(in_RCX + local_38))) break;
    local_38 = local_38 + 1;
    local_34 = skipEscapedLineEnds(in_RDI,in_ESI,local_34 + 1,matchlen);
  }
  return false;
}

Assistant:

static bool matchWhileUnsplitting(const char *buffer, int buffer_len, int start,
                                  const char *needle, int needle_len,
                                  int *matchlen, int *lines)
{
    int x = start;
    for (int n = 0; n < needle_len;
         n++, x = skipEscapedLineEnds(buffer, buffer_len, x + 1, lines)) {
        if (x >= buffer_len || buffer[x] != needle[n])
            return false;
    }
    // That also skipped any remaining BSNLs immediately after the match.

    // Tell caller how long the match was:
    *matchlen = x - start;

    return true;
}